

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int av1_set_internal_size
              (AV1EncoderConfig *oxcf,ResizePendingParams *resize_pending_params,
              AOM_SCALING_MODE horiz_mode,AOM_SCALING_MODE vert_mode)

{
  AOM_SCALING_MODE in_ECX;
  AOM_SCALING_MODE in_EDX;
  int *in_RSI;
  long in_RDI;
  int vs;
  int vr;
  int hs;
  int hr;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  AOM_SCALING_MODE local_20;
  AOM_SCALING_MODE local_1c;
  int *local_18;
  long local_10;
  int local_4;
  
  local_24 = 0;
  local_28 = 0;
  local_2c = 0;
  local_30 = 0;
  if ((in_EDX < (AOME_ONETHREE|AOME_FOURFIVE)) && (in_ECX < (AOME_ONETHREE|AOME_FOURFIVE))) {
    local_20 = in_ECX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    Scale2Ratio(in_EDX,&local_24,&local_28);
    Scale2Ratio(local_20,&local_2c,&local_30);
    *local_18 = (local_28 + -1 + *(int *)(local_10 + 0x18) * local_24) / local_28;
    local_18[1] = (local_30 + -1 + *(int *)(local_10 + 0x1c) * local_2c) / local_30;
    if ((local_1c != AOME_NORMAL) || (local_20 != AOME_NORMAL)) {
      *(undefined1 *)(local_10 + 0xe8) = 1;
      *(undefined1 *)(local_10 + 0x41) = 0;
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int av1_set_internal_size(AV1EncoderConfig *const oxcf,
                          ResizePendingParams *resize_pending_params,
                          AOM_SCALING_MODE horiz_mode,
                          AOM_SCALING_MODE vert_mode) {
  int hr = 0, hs = 0, vr = 0, vs = 0;

  // Checks for invalid AOM_SCALING_MODE values.
  if (horiz_mode > AOME_ONETHREE || vert_mode > AOME_ONETHREE) return -1;

  Scale2Ratio(horiz_mode, &hr, &hs);
  Scale2Ratio(vert_mode, &vr, &vs);

  // always go to the next whole number
  resize_pending_params->width = (hs - 1 + oxcf->frm_dim_cfg.width * hr) / hs;
  resize_pending_params->height = (vs - 1 + oxcf->frm_dim_cfg.height * vr) / vs;

  if (horiz_mode != AOME_NORMAL || vert_mode != AOME_NORMAL) {
    oxcf->resize_cfg.resize_mode = RESIZE_FIXED;
    oxcf->algo_cfg.enable_tpl_model = 0;
  }
  return 0;
}